

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordTopocentric.h
# Opt level: O2

CoordTopocentric * __thiscall
CoordTopocentric::operator=(CoordTopocentric *this,CoordTopocentric *topo)

{
  double dVar1;
  
  if (this != topo) {
    dVar1 = topo->elevation;
    this->azimuth = topo->azimuth;
    this->elevation = dVar1;
    dVar1 = topo->range_rate;
    this->range = topo->range;
    this->range_rate = dVar1;
  }
  return this;
}

Assistant:

CoordTopocentric& operator=(const CoordTopocentric& topo)
    {
        if (this != &topo)
        {
            azimuth = topo.azimuth;
            elevation = topo.elevation;
            range = topo.range;
            range_rate = topo.range_rate;
        }
        return *this;
    }